

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlNewDocNoDtD(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  htmlDocPtr val_01;
  int local_34;
  int n_ExternalID;
  xmlChar *ExternalID;
  int n_URI;
  xmlChar *URI;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (ExternalID._4_4_ = 0; (int)ExternalID._4_4_ < 5; ExternalID._4_4_ = ExternalID._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_xmlChar_ptr(ExternalID._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_34,1);
      val_01 = (htmlDocPtr)htmlNewDocNoDtD(val,val_00);
      desret_htmlDocPtr(val_01);
      call_tests = call_tests + 1;
      des_const_xmlChar_ptr(ExternalID._4_4_,val,0);
      des_const_xmlChar_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDocNoDtD",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)ExternalID._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlNewDocNoDtD(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    xmlChar * URI; /* URI for the dtd, or NULL */
    int n_URI;
    xmlChar * ExternalID; /* the external ID of the DTD, or NULL */
    int n_ExternalID;

    for (n_URI = 0;n_URI < gen_nb_const_xmlChar_ptr;n_URI++) {
    for (n_ExternalID = 0;n_ExternalID < gen_nb_const_xmlChar_ptr;n_ExternalID++) {
        mem_base = xmlMemBlocks();
        URI = gen_const_xmlChar_ptr(n_URI, 0);
        ExternalID = gen_const_xmlChar_ptr(n_ExternalID, 1);

        ret_val = htmlNewDocNoDtD((const xmlChar *)URI, (const xmlChar *)ExternalID);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_URI, (const xmlChar *)URI, 0);
        des_const_xmlChar_ptr(n_ExternalID, (const xmlChar *)ExternalID, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlNewDocNoDtD",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_URI);
            printf(" %d", n_ExternalID);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}